

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  Unique<vk::Handle<(vk::HandleType)21>_> *this;
  PlatformInterface *pPVar1;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  Unique<vk::Handle<(vk::HandleType)22>_> *ptr;
  ProgramCollection<vk::ProgramBinary> *pPVar7;
  ulong uVar8;
  long lVar9;
  size_type __n;
  bool bVar10;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  objects;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_298;
  Resources res;
  Environment env;
  Resources res_1;
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&res,allocator,0x400);
  pPVar1 = context->m_platformInterface;
  pDVar2 = Context::getDeviceInterface(context);
  pVVar3 = Context::getDevice(context);
  env.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  pPVar7 = context->m_progCollection;
  env.allocationCallbacks = (VkAllocationCallbacks *)&res.descriptorPool.object;
  env.maxResourceConsumers = 1;
  env.vkp = pPVar1;
  env.vkd = pDVar2;
  env.device = pVVar3;
  env.programBinaries = pPVar7;
  DescriptorSet::Resources::Resources(&res_1,&env,params);
  sVar4 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)&res);
  DescriptorSet::create
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&local_298,&env,&res_1,(Parameters *)pPVar7);
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_298.m_data.deleter.m_device;
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_298.m_data.object.m_internal;
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_298.m_data.deleter.m_deviceIface;
  local_298.m_data.object.m_internal = 0;
  local_298.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_298.m_data.deleter.m_device = (VkDevice)0x0;
  local_298.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_298);
  sVar5 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)&res);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&objects);
  DescriptorSet::Resources::~Resources(&res_1);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder((AllocationCallbackRecorder *)&res);
  sVar4 = getSafeObjectCount(context,sVar5 - sVar4,0);
  __n = 0x4000;
  if (sVar4 < 0x4000) {
    __n = sVar4;
  }
  Environment::Environment(&env,context,(deUint32)__n);
  DescriptorSet::Resources::Resources(&res,&env,params);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::vector(&objects,__n,(allocator_type *)&res_1);
  res_1.descriptorPool._0_8_ = context->m_testCtx->m_log;
  this = &res_1.descriptorPool.object;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,"Creating ");
  std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::operator<<((ostream *)this," ");
  pcVar6 = ::vk::getTypeName<vk::Handle<(vk::HandleType)22>>();
  std::operator<<((ostream *)this,pcVar6);
  std::operator<<((ostream *)this," objects");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  lVar9 = 0;
  for (uVar8 = 0; __n != uVar8; uVar8 = uVar8 + 1) {
    ptr = (Unique<vk::Handle<(vk::HandleType)22>_> *)operator_new(0x20);
    DescriptorSet::create
              ((Move<vk::Handle<(vk::HandleType)22>_> *)&res_1,&env,&res,(Parameters *)pPVar7);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device =
         (VkDevice)
         res_1.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
         m_deviceIface;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal =
         (deUint64)
         res_1.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
         m_device;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
         res_1.descriptorPool._0_8_;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         res_1.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
         m_internal;
    res_1.descriptorPool._0_8_ = 0;
    res_1.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
    m_internal = 0;
    res_1.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)0x0;
    res_1.descriptorPool.object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_device = (VkDevice)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)&local_298,ptr
              );
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)
               ((long)&(objects.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar9),
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)&local_298);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)&local_298);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&res_1);
    bVar10 = (uVar8 & 0x3ff) != 0;
    pPVar7 = (ProgramCollection<vk::ProgramBinary> *)
             CONCAT71((int7)((ulong)pPVar7 >> 8),bVar10 || uVar8 == 0);
    if (!bVar10 && uVar8 != 0) {
      tcu::TestContext::touchWatchdog(context->m_testCtx);
    }
    lVar9 = lVar9 + 0x10;
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::clear(&objects);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&res_1,"Ok",(allocator<char> *)&local_298);
  tcu::TestStatus::pass(__return_storage_ptr__,(string *)&res_1);
  std::__cxx11::string::~string((string *)&res_1);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::~vector(&objects);
  DescriptorSet::Resources::~Resources(&res);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}